

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O0

gotcha_error_t
get_configuration_value(char *tool_name,gotcha_config_key_t key,void *location_to_store_result)

{
  int iVar1;
  FILE *pFVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  int *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  int current_priority;
  gotcha_configuration_t config;
  int found_valid_value;
  tool_t *tool;
  char *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  gotcha_config_key_t key_00;
  char *local_58;
  tool_t *local_28;
  gotcha_error_t local_4;
  
  key_00 = (gotcha_config_key_t)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  local_28 = get_tool(in_stack_ffffffffffffff78);
  pFVar2 = _stderr;
  if (local_28 == (tool_t *)0x0) {
    if (debug_level != 0) {
      uVar3 = gotcha_gettid();
      uVar4 = getpid();
      local_58 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/tool.c"
                         ,0x2f);
      if (local_58 == (char *)0x0) {
        local_58 = "";
      }
      fprintf(pFVar2,"ERROR [%d/%d][%s:%u] - Property being examined for nonexistent tool %s\n",
              (ulong)uVar3,(ulong)uVar4,local_58 + 1,0xab,in_RDI);
    }
    local_4 = GOTCHA_INVALID_TOOL;
  }
  else {
    get_default_configuration_value(key_00,in_stack_ffffffffffffff78);
    pFVar2 = _stderr;
    for (; local_28 != (tool_t *)0x0; local_28 = local_28->parent_tool) {
      iVar1 = (local_28->config).priority;
      if (in_ESI != 0) {
        if (debug_level != 0) {
          uVar3 = gotcha_gettid();
          uVar4 = getpid();
          pcVar5 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/tool.c"
                           ,0x2f);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = "";
          }
          fprintf(pFVar2,"ERROR [%d/%d][%s:%u] - Invalid property being configured on tool %s\n",
                  (ulong)uVar3,(ulong)uVar4,pcVar5 + 1,0xbb,in_RDI);
        }
        return GOTCHA_INTERNAL;
      }
      if (iVar1 != -1) {
        *in_RDX = iVar1;
        return GOTCHA_SUCCESS;
      }
    }
    local_4 = GOTCHA_SUCCESS;
  }
  return local_4;
}

Assistant:

enum gotcha_error_t get_configuration_value(const char* tool_name, enum gotcha_config_key_t key, void* location_to_store_result){
  struct tool_t* tool = get_tool(tool_name);
  if(tool==NULL){
     error_printf("Property being examined for nonexistent tool %s\n", tool_name);
     return GOTCHA_INVALID_TOOL;
  }
  get_default_configuration_value(key, location_to_store_result);
  int found_valid_value = 0;
  while( (tool!=NULL) && !(found_valid_value) ){
    struct gotcha_configuration_t config = tool->config;
    if(key==GOTCHA_PRIORITY){
      int current_priority = config.priority;
      if(current_priority!=UNSET_PRIORITY){
        *((int*)(location_to_store_result)) = config.priority; 
        found_valid_value = 1;
        return GOTCHA_SUCCESS;
      }
    }
    else{
      error_printf("Invalid property being configured on tool %s\n", tool_name);
      return GOTCHA_INTERNAL;
    }
    tool = tool->parent_tool;
  }
  return GOTCHA_SUCCESS;  
}